

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

void xmlFreeStreamCtxt(xmlStreamCtxtPtr stream)

{
  _xmlStreamCtxt *p_Var1;
  
  if (stream != (xmlStreamCtxtPtr)0x0) {
    do {
      p_Var1 = stream->next;
      if (stream->states != (int *)0x0) {
        (*xmlFree)(stream->states);
      }
      (*xmlFree)(stream);
      stream = p_Var1;
    } while (p_Var1 != (_xmlStreamCtxt *)0x0);
  }
  return;
}

Assistant:

void
xmlFreeStreamCtxt(xmlStreamCtxtPtr stream) {
    xmlStreamCtxtPtr next;

    while (stream != NULL) {
        next = stream->next;
        if (stream->states != NULL)
	    xmlFree(stream->states);
        xmlFree(stream);
	stream = next;
    }
}